

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bstricmp(const_bstring b0,const_bstring b1)

{
  int iVar1;
  int iVar2;
  uchar *local_40;
  uchar *local_38;
  int local_2c;
  int n;
  int v;
  int i;
  const_bstring b1_local;
  const_bstring b0_local;
  
  if ((b0 == (const_bstring)0x0) || (b0->data == (uchar *)0x0)) {
    local_38 = (uchar *)0x0;
  }
  else {
    local_38 = b0->data;
  }
  if ((local_38 != (uchar *)0x0) && (-1 < b0->slen)) {
    if ((b1 == (const_bstring)0x0) || (b1->data == (uchar *)0x0)) {
      local_40 = (uchar *)0x0;
    }
    else {
      local_40 = b1->data;
    }
    if ((local_40 != (uchar *)0x0) && (-1 < b1->slen)) {
      local_2c = b0->slen;
      if (b1->slen < local_2c) {
        local_2c = b1->slen;
      }
      else if ((b0->slen == b1->slen) && (b0->data == b1->data)) {
        return 0;
      }
      for (n = 0; n < local_2c; n = n + 1) {
        iVar1 = tolower((uint)b0->data[n]);
        iVar2 = tolower((uint)b1->data[n]);
        iVar1 = (int)(char)iVar1 - (int)(char)iVar2;
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      if (local_2c < b0->slen) {
        iVar1 = tolower((uint)b0->data[local_2c]);
        if ((char)iVar1 != 0) {
          return (int)(char)iVar1;
        }
        return 0x100;
      }
      if (b1->slen <= local_2c) {
        return 0;
      }
      iVar1 = tolower((uint)b1->data[local_2c]);
      if (-(int)(char)iVar1 != 0) {
        return -(int)(char)iVar1;
      }
      return -0x100;
    }
  }
  return -0x8000;
}

Assistant:

int bstricmp (const_bstring b0, const_bstring b1) {
int i, v, n;

	if (bdata (b0) == NULL || b0->slen < 0 ||
	    bdata (b1) == NULL || b1->slen < 0) return SHRT_MIN;
	if ((n = b0->slen) > b1->slen) n = b1->slen;
	else if (b0->slen == b1->slen && b0->data == b1->data) return BSTR_OK;

	for (i = 0; i < n; i ++) {
		v  = (char) downcase (b0->data[i])
		   - (char) downcase (b1->data[i]);
		if (0 != v) return v;
	}

	if (b0->slen > n) {
		v = (char) downcase (b0->data[n]);
		if (v) return v;
		return UCHAR_MAX + 1;
	}
	if (b1->slen > n) {
		v = - (char) downcase (b1->data[n]);
		if (v) return v;
		return - (int) (UCHAR_MAX + 1);
	}
	return BSTR_OK;
}